

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chared.c
# Opt level: O2

void ch_end(EditLine *el)

{
  free((el->el_line).buffer);
  (el->el_line).buffer = (wchar_t *)0x0;
  (el->el_line).limit = (wchar_t *)0x0;
  free((el->el_chared).c_undo.buf);
  (el->el_chared).c_undo.buf = (wchar_t *)0x0;
  free((el->el_chared).c_redo.buf);
  (el->el_chared).c_redo.lim = (wchar_t *)0x0;
  (el->el_chared).c_redo.buf = (wchar_t *)0x0;
  (el->el_chared).c_redo.pos = (wchar_t *)0x0;
  (el->el_chared).c_redo.cmd = '\x1c';
  free((el->el_chared).c_kill.buf);
  (el->el_chared).c_kill.buf = (wchar_t *)0x0;
  ch_reset(el);
  return;
}

Assistant:

libedit_private void
ch_end(EditLine *el)
{
	el_free(el->el_line.buffer);
	el->el_line.buffer = NULL;
	el->el_line.limit = NULL;
	el_free(el->el_chared.c_undo.buf);
	el->el_chared.c_undo.buf = NULL;
	el_free(el->el_chared.c_redo.buf);
	el->el_chared.c_redo.buf = NULL;
	el->el_chared.c_redo.pos = NULL;
	el->el_chared.c_redo.lim = NULL;
	el->el_chared.c_redo.cmd = ED_UNASSIGNED;
	el_free(el->el_chared.c_kill.buf);
	el->el_chared.c_kill.buf = NULL;
	ch_reset(el);
}